

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateVkImpl::ShaderStageInfo::Append(ShaderStageInfo *this,ShaderVkImpl *pShader)

{
  SHADER_TYPE ShaderType;
  ShaderBase<Diligent::EngineVkImplTraits> *pSVar1;
  __normal_iterator<const_Diligent::ShaderVkImpl_**,_std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>_>
  _Var2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  char (*in_RCX) [34];
  char (*in_R8) [61];
  char (*in_stack_ffffffffffffff98) [3];
  ShaderVkImpl *pShader_local;
  string msg;
  Char *local_38;
  Char *local_30;
  
  pShader_local = pShader;
  if (pShader == (ShaderVkImpl *)0x0) {
    FormatString<char[26],char[19]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"pShader != nullptr",
               (char (*) [19])in_RCX);
    in_RCX = (char (*) [34])0x235;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Append",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x235);
    std::__cxx11::string::~string((string *)&msg);
  }
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<Diligent::ShaderVkImpl_const**,std::vector<Diligent::ShaderVkImpl_const*,std::allocator<Diligent::ShaderVkImpl_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<Diligent::ShaderVkImpl_const*const>>
                    ((this->Shaders).
                     super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->Shaders).
                     super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&pShader_local);
  if (_Var2._M_current !=
      (this->Shaders).
      super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[9],char_const*,char[61]>
              (&msg,(Diligent *)"Shader \'",
               (char (*) [9])
               &(pShader_local->super_ShaderBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                .m_Desc,(char **)"\' already exists in the stage. Shaders must be deduplicated.",
               in_R8);
    in_RCX = (char (*) [34])0x237;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Append",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x237);
    std::__cxx11::string::~string((string *)&msg);
  }
  ShaderType = (pShader_local->super_ShaderBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
               .m_Desc.ShaderType;
  if (this->Type == SHADER_TYPE_UNKNOWN) {
    if (((this->Shaders).
         super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->Shaders).
         super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((this->SPIRVs).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->SPIRVs).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      FormatString<char[26],char[34]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Shaders.empty() && SPIRVs.empty()",in_RCX);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Append",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x23c);
      std::__cxx11::string::~string((string *)&msg);
    }
    this->Type = ShaderType;
  }
  else if (this->Type != ShaderType) {
    local_30 = GetShaderTypeLiteralName(ShaderType);
    pSVar1 = &pShader_local->super_ShaderBase<Diligent::EngineVkImplTraits>;
    local_38 = GetShaderTypeLiteralName(this->Type);
    FormatString<char[11],char_const*,char[14],char_const*,char[65],char_const*,char[3]>
              (&msg,(Diligent *)"The type (",(char (*) [11])&local_30,(char **)") of shader \'",
               (char (*) [14])
               &(pSVar1->
                super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                ).m_Desc,
               (char **)"\' being added to the stage is inconsistent with the stage type (",
               (char (*) [65])&local_38,(char **)0x668694,in_stack_ffffffffffffff98);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Append",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x243);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
  push_back(&this->Shaders,&pShader_local);
  __x = ShaderVkImpl::GetSPIRV(pShader_local);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back(&this->SPIRVs,__x);
  return;
}

Assistant:

void PipelineStateVkImpl::ShaderStageInfo::Append(const ShaderVkImpl* pShader)
{
    VERIFY_EXPR(pShader != nullptr);
    VERIFY(std::find(Shaders.begin(), Shaders.end(), pShader) == Shaders.end(),
           "Shader '", pShader->GetDesc().Name, "' already exists in the stage. Shaders must be deduplicated.");

    const SHADER_TYPE NewShaderType = pShader->GetDesc().ShaderType;
    if (Type == SHADER_TYPE_UNKNOWN)
    {
        VERIFY_EXPR(Shaders.empty() && SPIRVs.empty());
        Type = NewShaderType;
    }
    else
    {
        VERIFY(Type == NewShaderType, "The type (", GetShaderTypeLiteralName(NewShaderType),
               ") of shader '", pShader->GetDesc().Name, "' being added to the stage is inconsistent with the stage type (",
               GetShaderTypeLiteralName(Type), ").");
    }
    Shaders.push_back(pShader);
    SPIRVs.push_back(pShader->GetSPIRV());
}